

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

ConstantValue *
slang::ast::constContainer(Type *type,span<slang::ConstantValue,_18446744073709551615UL> elems)

{
  QueueType *this;
  allocator_type *in_RDI;
  SVQueue result;
  Type *ct;
  span<slang::ConstantValue,_18446744073709551615UL> *in_stack_fffffffffffffee8;
  SVQueue *in_stack_fffffffffffffef0;
  span<slang::ConstantValue,_18446744073709551615UL> *in_stack_fffffffffffffef8;
  __normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
  queue;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_ffffffffffffff00;
  __normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
  _Var1;
  allocator_type *this_00;
  SymbolKind SVar2;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  allocator<slang::ConstantValue> local_51;
  ConstantValue *local_50;
  ConstantValue *local_48;
  Type *local_28;
  span<slang::ConstantValue,_18446744073709551615UL> local_18;
  
  this_00 = in_RDI;
  local_28 = Type::getCanonicalType((Type *)in_stack_fffffffffffffef0);
  SVar2 = (local_28->super_Symbol).kind;
  if ((SVar2 - FixedSizeUnpackedArrayType < 2) || (SVar2 != QueueType)) {
    local_48 = (ConstantValue *)
               std::span<slang::ConstantValue,_18446744073709551615UL>::begin
                         (in_stack_fffffffffffffee8);
    local_50 = (ConstantValue *)
               std::span<slang::ConstantValue,_18446744073709551615UL>::end
                         (in_stack_fffffffffffffef8);
    std::allocator<slang::ConstantValue>::allocator((allocator<slang::ConstantValue> *)0x79aeee);
    _Var1._M_current._4_4_ = in_stack_ffffffffffffff2c;
    _Var1._M_current._0_4_ = SVar2;
    std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
    vector<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::span<slang::ConstantValue,18446744073709551615ul>>,void>
              ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)this_00,
               (__normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
                )in_stack_ffffffffffffff30,_Var1,in_RDI);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffef0,(Elements *)in_stack_fffffffffffffee8);
    std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
              (in_stack_ffffffffffffff00);
    std::allocator<slang::ConstantValue>::~allocator(&local_51);
  }
  else {
    queue._M_current = (ConstantValue *)&local_18;
    std::span<slang::ConstantValue,_18446744073709551615UL>::begin(in_stack_fffffffffffffee8);
    std::span<slang::ConstantValue,_18446744073709551615UL>::end
              ((span<slang::ConstantValue,_18446744073709551615UL> *)queue._M_current);
    _Var1._M_current = (ConstantValue *)&stack0xffffffffffffff2f;
    std::allocator<slang::ConstantValue>::allocator((allocator<slang::ConstantValue> *)0x79afc3);
    SVQueue::
    deque<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::span<slang::ConstantValue,18446744073709551615ul>>,void>
              (in_stack_fffffffffffffef0,_Var1,queue,(allocator_type *)in_stack_fffffffffffffee8);
    std::allocator<slang::ConstantValue>::~allocator
              ((allocator<slang::ConstantValue> *)&stack0xffffffffffffff2f);
    this = Symbol::as<slang::ast::QueueType>((Symbol *)0x79aff5);
    SVQueue::resizeToBound((SVQueue *)this);
    slang::ConstantValue::ConstantValue(_Var1._M_current,(SVQueue *)queue._M_current);
    SVQueue::~SVQueue((SVQueue *)0x79b032);
  }
  return (ConstantValue *)this_00;
}

Assistant:

static ConstantValue constContainer(const Type& type, std::span<ConstantValue> elems) {
    auto& ct = type.getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::FixedSizeUnpackedArrayType:
        case SymbolKind::DynamicArrayType:
        case SymbolKind::UnpackedStructType:
            return ConstantValue::Elements(elems.begin(), elems.end());
        case SymbolKind::QueueType: {
            SVQueue result(elems.begin(), elems.end());
            result.maxBound = ct.as<QueueType>().maxBound;
            result.resizeToBound();
            return result;
        }
        default:
            SLANG_UNREACHABLE;
    }
}